

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::ScalarReplacementPass::ReplaceWholeStore
          (ScalarReplacementPass *this,Instruction *store,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *replacements)

{
  ScalarReplacementPass *pSVar1;
  IRContext *pIVar2;
  IRContext *c;
  uint32_t uVar3;
  uint32_t uVar4;
  Instruction *this_00;
  DefUseManager *pDVar5;
  Instruction *pIVar6;
  Operand *pOVar7;
  uint32_t i;
  long lVar8;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  initializer_list<unsigned_int> init_list_02;
  iterator iter;
  Instruction *local_168;
  int local_15c;
  ScalarReplacementPass *local_158;
  IRContext *local_150;
  IRContext *local_148;
  uint32_t local_140;
  uint32_t local_13c;
  uint local_138;
  uint32_t local_134;
  BasicBlock *local_130;
  pointer local_128;
  pointer local_120;
  Instruction *local_118;
  iterator where;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  Instruction *local_e8;
  Operand copy;
  SmallVector<unsigned_int,_2UL> local_a8;
  SmallVector<unsigned_int,_2UL> local_80;
  SmallVector<unsigned_int,_2UL> local_58;
  
  local_140 = Instruction::GetSingleWordInOperand(store,1);
  local_158 = this;
  local_130 = IRContext::get_instr_block((this->super_MemPass).super_Pass.context_,store);
  local_120 = (replacements->
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
  local_128 = (replacements->
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  local_15c = 0;
  where.super_iterator.node_ = (iterator)(iterator)store;
  for (; pSVar1 = local_158, local_120 != local_128; local_120 = local_120 + 1) {
    pIVar6 = *local_120;
    if (pIVar6->opcode_ == OpVariable) {
      this_00 = GetStorageType(local_158,pIVar6);
      uVar3 = Pass::TakeNextId((Pass *)pSVar1);
      if (uVar3 == 0) break;
      local_e8 = pIVar6;
      local_150 = (IRContext *)operator_new(0x70);
      local_148 = (local_158->super_MemPass).super_Pass.context_;
      local_13c = Instruction::result_id(this_00);
      iter.super_iterator.node_._0_4_ = local_140;
      init_list._M_len = 1;
      init_list._M_array = (iterator)&iter;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list);
      copy.type = SPV_OPERAND_TYPE_ID;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&copy.words,&local_58);
      local_168 = (Instruction *)CONCAT44(local_168._4_4_,local_15c);
      init_list_00._M_len = 1;
      init_list_00._M_array = (iterator)&local_168;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_80,init_list_00);
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_a8,&local_80);
      local_108 = 0;
      uStack_100 = 0;
      local_f8 = 0;
      std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
      _M_range_initialize<spvtools::opt::Operand_const*>
                ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_108
                 ,&copy,&local_80);
      c = local_148;
      pIVar2 = local_150;
      local_148 = (IRContext *)CONCAT44(local_148._4_4_,uVar3);
      Instruction::Instruction
                ((Instruction *)local_150,c,OpCompositeExtract,local_13c,uVar3,
                 (OperandList *)&local_108);
      local_118 = (Instruction *)pIVar2;
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                 &local_108);
      lVar8 = 0x38;
      do {
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                  ((SmallVector<unsigned_int,_2UL> *)((long)(copy.words.buffer + -6) + lVar8));
        lVar8 = lVar8 + -0x30;
      } while (lVar8 != -0x28);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_80);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
      InstructionList::iterator::InsertBefore
                (&iter,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                        *)&where);
      Instruction::UpdateDebugInfoFrom((Instruction *)iter.super_iterator.node_,store);
      pSVar1 = local_158;
      pDVar5 = Pass::get_def_use_mgr((Pass *)local_158);
      analysis::DefUseManager::AnalyzeInstDefUse(pDVar5,(Instruction *)iter.super_iterator.node_);
      IRContext::set_instr_block
                ((pSVar1->super_MemPass).super_Pass.context_,
                 (Instruction *)iter.super_iterator.node_,local_130);
      pIVar6 = (Instruction *)operator_new(0x70);
      local_150 = (pSVar1->super_MemPass).super_Pass.context_;
      local_134 = Instruction::result_id(local_e8);
      init_list_01._M_len = 1;
      init_list_01._M_array = &local_134;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list_01);
      copy.type = SPV_OPERAND_TYPE_ID;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&copy.words,&local_58);
      local_138 = (uint)local_148;
      init_list_02._M_len = 1;
      init_list_02._M_array = &local_138;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_80,init_list_02);
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_a8,&local_80);
      local_108 = 0;
      uStack_100 = 0;
      local_f8 = 0;
      std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
      _M_range_initialize<spvtools::opt::Operand_const*>
                ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_108
                 ,&copy,&local_80);
      Instruction::Instruction(pIVar6,local_150,OpStore,0,0,(OperandList *)&local_108);
      local_168 = pIVar6;
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                 &local_108);
      lVar8 = 0x38;
      do {
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                  ((SmallVector<unsigned_int,_2UL> *)((long)(copy.words.buffer + -6) + lVar8));
        lVar8 = lVar8 + -0x30;
      } while (lVar8 != -0x28);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_80);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
      for (uVar3 = 2; uVar4 = Instruction::NumInOperands(store), uVar3 < uVar4; uVar3 = uVar3 + 1) {
        pOVar7 = Instruction::GetInOperand(store,uVar3);
        Operand::Operand(&copy,pOVar7);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
        emplace_back<spvtools::opt::Operand>(&local_168->operands_,&copy);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&copy.words);
      }
      InstructionList::iterator::InsertBefore
                ((iterator *)&copy,
                 (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  *)&where);
      iter.super_iterator.node_._4_4_ = copy._4_4_;
      iter.super_iterator.node_._0_4_ = copy.type;
      Instruction::UpdateDebugInfoFrom((Instruction *)iter.super_iterator.node_,store);
      pSVar1 = local_158;
      pDVar5 = Pass::get_def_use_mgr((Pass *)local_158);
      analysis::DefUseManager::AnalyzeInstDefUse(pDVar5,(Instruction *)iter.super_iterator.node_);
      IRContext::set_instr_block
                ((pSVar1->super_MemPass).super_Pass.context_,
                 (Instruction *)iter.super_iterator.node_,local_130);
      if (local_168 != (Instruction *)0x0) {
        (*(local_168->super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase
          [1])();
      }
      if (local_118 != (Instruction *)0x0) {
        (*(local_118->super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase
          [1])();
      }
    }
    local_15c = local_15c + 1;
  }
  return local_120 == local_128;
}

Assistant:

bool ScalarReplacementPass::ReplaceWholeStore(
    Instruction* store, const std::vector<Instruction*>& replacements) {
  // Replaces a store to the whole composite with a series of extract and stores
  // to each element.
  uint32_t storeInput = store->GetSingleWordInOperand(1u);
  BasicBlock* block = context()->get_instr_block(store);
  BasicBlock::iterator where(store);
  uint32_t elementIndex = 0;
  for (auto var : replacements) {
    // Create the extract.
    if (var->opcode() != spv::Op::OpVariable) {
      elementIndex++;
      continue;
    }

    Instruction* type = GetStorageType(var);
    uint32_t extractId = TakeNextId();
    if (extractId == 0) {
      return false;
    }
    std::unique_ptr<Instruction> extract(new Instruction(
        context(), spv::Op::OpCompositeExtract, type->result_id(), extractId,
        std::initializer_list<Operand>{
            {SPV_OPERAND_TYPE_ID, {storeInput}},
            {SPV_OPERAND_TYPE_LITERAL_INTEGER, {elementIndex++}}}));
    auto iter = where.InsertBefore(std::move(extract));
    iter->UpdateDebugInfoFrom(store);
    get_def_use_mgr()->AnalyzeInstDefUse(&*iter);
    context()->set_instr_block(&*iter, block);

    // Create the store.
    std::unique_ptr<Instruction> newStore(
        new Instruction(context(), spv::Op::OpStore, 0, 0,
                        std::initializer_list<Operand>{
                            {SPV_OPERAND_TYPE_ID, {var->result_id()}},
                            {SPV_OPERAND_TYPE_ID, {extractId}}}));
    // Copy memory access attributes which start at index 2. Index 0 is the
    // pointer and index 1 is the data.
    for (uint32_t i = 2; i < store->NumInOperands(); ++i) {
      Operand copy(store->GetInOperand(i));
      newStore->AddOperand(std::move(copy));
    }
    iter = where.InsertBefore(std::move(newStore));
    iter->UpdateDebugInfoFrom(store);
    get_def_use_mgr()->AnalyzeInstDefUse(&*iter);
    context()->set_instr_block(&*iter, block);
  }
  return true;
}